

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

char * doctest::failureString(Enum at)

{
  char *pcVar1;
  
  if ((at & is_warn) != 0) {
    return "WARNING";
  }
  if ((at & is_check) == 0) {
    pcVar1 = "FATAL ERROR";
    if ((at & is_require) == 0) {
      pcVar1 = "";
    }
    return pcVar1;
  }
  return "ERROR";
}

Assistant:

const char* failureString(assertType::Enum at) {
    if(at & assertType::is_warn) //!OCLINT bitwise operator in conditional
        return "WARNING";
    if(at & assertType::is_check) //!OCLINT bitwise operator in conditional
        return "ERROR";
    if(at & assertType::is_require) //!OCLINT bitwise operator in conditional
        return "FATAL ERROR";
    return "";
}